

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mysqlhs.c
# Opt level: O0

int test_(void)

{
  mysqlhs_context *c_00;
  int z;
  mysqlhs_context *c;
  
  mysqlhs_init();
  atexit(mysqlhs_end);
  c_00 = mysqlhs_connect("127.0.0.1",9999);
  if (c_00 == (mysqlhs_context *)0x0) {
    printf("failed to connect");
    c._4_4_ = 1;
  }
  else {
    mysqlhs_execute(c_00,"P\t0\ttest\tmovie\tPRIMARY\tid,genre,title,view_count\n");
    if (c_00->result == 0) {
      printf("%s",c_00->data);
      mysqlhs_execute(c_00,"0\t+\t3\t0\tSci-Fi\tStar wars\n");
      if (c_00->result == 0) {
        printf("%s",c_00->data);
        mysqlhs_execute(c_00,"0\t>\t1\t0\t10\t0\n");
        if (c_00->result == 0) {
          printf("%s",c_00->data);
          mysqlhs_close(c_00);
          getchar();
          c._4_4_ = 0;
        }
        else {
          printf("failed to select");
          c._4_4_ = 1;
        }
      }
      else {
        printf("failed to insert");
        c._4_4_ = 1;
      }
    }
    else {
      printf("failed to open");
      c._4_4_ = 1;
    }
  }
  return c._4_4_;
}

Assistant:

int test_()
{
	mysqlhs_init();
	atexit(mysqlhs_end);

	mysqlhs_context* c = mysqlhs_connect("127.0.0.1", 9999);
	if (c == NULL)
	{
		printf("failed to connect");
		return 1;
	}

	mysqlhs_execute(c, "P	0	test	movie	PRIMARY	id,genre,title,view_count\n");
	if (c->result != MYSQL_HS_OK)
	{
		printf("failed to open");
		return 1;
	}
	printf("%s", c->data);

	mysqlhs_execute(c, "0	+	3	0	Sci-Fi	Star wars\n");
	if (c->result != MYSQL_HS_OK)
	{
		printf("failed to insert");
		return 1;
	}
	printf("%s", c->data);

	mysqlhs_execute(c, "0	>	1	0	10	0\n");
	if (c->result != MYSQL_HS_OK)
	{
		printf("failed to select");
		return 1;
	}
	printf("%s", c->data);
	
	mysqlhs_close(c);
	
	int z = getchar();
	return 0;
}